

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::cert_compression_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  _Head_base<0UL,_ssl_ctx_st_*,_false> _Var1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  long lVar6;
  bool bVar7;
  char cVar8;
  CBB algs;
  CBB contents;
  CBB local_90;
  CBB local_60;
  
  _Var1._M_head_impl =
       (hs->ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
  sVar2 = *(size_t *)((long)&(_Var1._M_head_impl)->cert_compression_algs + 8);
  bVar7 = sVar2 == 0;
  if (bVar7) {
    bVar5 = true;
  }
  else {
    lVar3 = (long)((_Var1._M_head_impl)->cert_compression_algs).data_;
    bVar5 = true;
    lVar6 = 0;
    do {
      if (*(long *)(lVar3 + 8 + lVar6) == 0) {
        cVar8 = '\x03';
      }
      else if (bVar5) {
        iVar4 = CBB_add_u16(out_compressible,0x1b);
        cVar8 = '\x01';
        if (iVar4 != 0) {
          iVar4 = CBB_add_u16_length_prefixed(out_compressible,&local_60);
          if ((iVar4 != 0) && (iVar4 = CBB_add_u8_length_prefixed(&local_60,&local_90), iVar4 != 0))
          goto LAB_00249cfa;
        }
      }
      else {
LAB_00249cfa:
        iVar4 = CBB_add_u16(&local_90,*(uint16_t *)(lVar3 + 0x10 + lVar6));
        cVar8 = iVar4 == 0;
        bVar5 = false;
      }
      if ((cVar8 != '\x03') && (cVar8 != '\0')) break;
      lVar6 = lVar6 + 0x18;
      bVar7 = sVar2 * 0x18 == lVar6;
    } while (!bVar7);
  }
  if ((~bVar7 & 1U) == 0 && !bVar5) {
    iVar4 = CBB_flush(out_compressible);
    bVar7 = iVar4 != 0;
  }
  return bVar7;
}

Assistant:

static bool cert_compression_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                             CBB *out_compressible,
                                             ssl_client_hello_type_t type) {
  bool first = true;
  CBB contents, algs;

  for (const auto &alg : hs->ssl->ctx->cert_compression_algs) {
    if (alg.decompress == nullptr) {
      continue;
    }

    if (first &&
        (!CBB_add_u16(out_compressible, TLSEXT_TYPE_cert_compression) ||
         !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
         !CBB_add_u8_length_prefixed(&contents, &algs))) {
      return false;
    }
    first = false;
    if (!CBB_add_u16(&algs, alg.alg_id)) {
      return false;
    }
  }

  return first || CBB_flush(out_compressible);
}